

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

void UninterruptibleSleep(microseconds *n)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(n);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UninterruptibleSleep(const std::chrono::microseconds& n) { std::this_thread::sleep_for(n); }